

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

char * archive_entry_fflags_text(archive_entry *entry)

{
  char cVar1;
  archive_mstring *aes;
  wchar_t wVar2;
  int *piVar3;
  size_t sVar4;
  flag *pfVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t __size;
  char *f;
  char *local_48;
  archive_entry *local_40;
  archive_mstring *local_38;
  
  wVar2 = archive_mstring_get_mbs(entry->archive,&entry->ae_fflags_text,&local_48);
  if (wVar2 == L'\0') {
    if (local_48 != (char *)0x0) {
      return local_48;
    }
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 == 0xc) goto LAB_003c823b;
  }
  uVar10 = entry->ae_fflags_set;
  if ((uVar10 != 0) || (entry->ae_fflags_clear != 0)) {
    uVar11 = entry->ae_fflags_clear;
    uVar8 = uVar11 | uVar10;
    pcVar9 = "nosappnd";
    pfVar5 = flags;
    __size = 0;
    local_40 = entry;
    local_38 = &entry->ae_fflags_text;
    do {
      pfVar5 = pfVar5 + 1;
      uVar12 = pfVar5[-1].clear | pfVar5[-1].set;
      if ((uVar12 & uVar8) != 0) {
        sVar4 = strlen(pcVar9);
        __size = __size + sVar4 + 1;
        uVar8 = uVar8 & ~uVar12;
      }
      pcVar9 = pfVar5->name;
    } while (pcVar9 != (char *)0x0);
    if ((__size == 0) || (pcVar9 = (char *)malloc(__size), pcVar9 == (char *)0x0)) {
      pcVar9 = (char *)0x0;
    }
    else {
      pfVar5 = flags;
      pcVar7 = "nosappnd";
      pcVar6 = pcVar9;
      do {
        uVar8 = pfVar5->set;
        if (((uVar8 & uVar10) == 0) && ((pfVar5->clear & uVar11) == 0)) {
          if ((uVar8 & uVar11) != 0 || (pfVar5->clear & uVar10) != 0) goto LAB_003c8184;
        }
        else {
          pcVar7 = pcVar7 + 2;
LAB_003c8184:
          uVar12 = pfVar5->clear;
          if (pcVar9 < pcVar6) {
            *pcVar6 = ',';
            pcVar6 = pcVar6 + 1;
          }
          uVar8 = ~(uVar8 | uVar12);
          uVar10 = uVar10 & uVar8;
          uVar11 = uVar11 & uVar8;
          pcVar6 = pcVar6 + -1;
          do {
            cVar1 = *pcVar7;
            pcVar7 = pcVar7 + 1;
            pcVar6[1] = cVar1;
            pcVar6 = pcVar6 + 1;
          } while (cVar1 != '\0');
        }
        pcVar7 = pfVar5[1].name;
        pfVar5 = pfVar5 + 1;
      } while (pcVar7 != (char *)0x0);
      *pcVar6 = '\0';
    }
    aes = local_38;
    if (pcVar9 != (char *)0x0) {
      archive_mstring_copy_mbs(local_38,pcVar9);
      free(pcVar9);
      wVar2 = archive_mstring_get_mbs(local_40->archive,aes,&local_48);
      if (wVar2 == L'\0') {
        return local_48;
      }
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) {
LAB_003c823b:
        __archive_errx(1,"No memory");
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
archive_entry_fflags_text(struct archive_entry *entry)
{
	const char *f;
	char *p;

	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0) {
		if (f != NULL)
			return (f);
	} else if (errno == ENOMEM)
		__archive_errx(1, "No memory");

	if (entry->ae_fflags_set == 0  &&  entry->ae_fflags_clear == 0)
		return (NULL);

	p = ae_fflagstostr(entry->ae_fflags_set, entry->ae_fflags_clear);
	if (p == NULL)
		return (NULL);

	archive_mstring_copy_mbs(&entry->ae_fflags_text, p);
	free(p);
	if (archive_mstring_get_mbs(entry->archive,
	    &entry->ae_fflags_text, &f) == 0)
		return (f);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}